

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O3

int floatx80_lt_quiet_mips64(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar6;
  bool bVar7;
  ushort uVar5;
  
  uVar3 = a.low;
  uVar2 = b.low;
  uVar5 = a.high;
  uVar4 = uVar5 & 0x7fff;
  if ((long)uVar3 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar1 = b.high;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) != (undefined1  [16])0x0 &&
        -1 < (long)uVar2) goto LAB_0086ede5;
    if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
         uVar4 == 0x7fff) ||
       (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) != (undefined1  [16])0x0 &&
        (uVar1 & 0x7fff) == 0x7fff)) {
      if (status->snan_bit_is_one == '\0') {
        if (((uVar4 != 0x7fff) ||
            (((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0))
           || (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0
              )) {
          bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) ==
                  (undefined1  [16])0x0 &&
                  ((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) !=
                  (undefined1  [16])0x0;
          goto LAB_0086eec0;
        }
      }
      else if (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) == (undefined1  [16])0x0
               || uVar4 != 0x7fff) {
        bVar7 = ((undefined1  [16])b & (undefined1  [16])0x4000000000000000) !=
                (undefined1  [16])0x0;
LAB_0086eec0:
        bVar6 = false;
        if (((uVar1 & 0x7fff) != 0x7fff) || (!bVar7)) goto LAB_0086edec;
      }
      goto LAB_0086ede5;
    }
    if (-1 < (short)(uVar1 ^ uVar5)) {
      if ((short)uVar5 < 0) {
        bVar6 = uVar1 < uVar5;
        bVar7 = uVar2 < uVar3;
      }
      else {
        bVar6 = uVar5 < uVar1;
        bVar7 = uVar3 < uVar2;
      }
      bVar6 = (bool)(bVar7 & uVar5 == uVar1 | bVar6);
      goto LAB_0086edec;
    }
    if ((short)uVar5 < 0) {
      bVar6 = (((b._8_4_ | a._8_4_) * 2 & 0xffff) != 0 || uVar3 != 0) || uVar2 != 0;
      goto LAB_0086edec;
    }
  }
  else {
LAB_0086ede5:
    status->float_exception_flags = status->float_exception_flags | 1;
  }
  bVar6 = false;
LAB_0086edec:
  return (int)bVar6;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}